

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CheckerInstanceBodySymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CheckerInstanceBodySymbol,slang::ast::Compilation&,slang::ast::CheckerSymbol_const&,slang::ast::AssertionInstanceDetails&,slang::ast::ASTContext_const&,unsigned_int&,bool&,slang::bitmask<slang::ast::InstanceFlags>&>
          (BumpAllocator *this,Compilation *args,CheckerSymbol *args_1,
          AssertionInstanceDetails *args_2,ASTContext *args_3,uint *args_4,bool *args_5,
          bitmask<slang::ast::InstanceFlags> *args_6)

{
  CheckerInstanceBodySymbol *pCVar1;
  AssertionInstanceDetails *in_RCX;
  CheckerSymbol *in_RDX;
  Compilation *in_RSI;
  CheckerInstanceBodySymbol *in_RDI;
  ASTContext *in_R8;
  undefined8 in_R9;
  bitmask<slang::ast::InstanceFlags> unaff_retaddr;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  
  pCVar1 = (CheckerInstanceBodySymbol *)
           allocate((BumpAllocator *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                    in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ast::CheckerInstanceBodySymbol::CheckerInstanceBodySymbol
            (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,(uint32_t)((ulong)in_R9 >> 0x20),
             SUB81((ulong)in_R9 >> 0x18,0),unaff_retaddr);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }